

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  FILE *pFile;
  mz_zip_archive_file_stat file_stat;
  mz_bool status;
  mz_uint flags_local;
  char *pDst_filename_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  file_stat.m_comment._252_4_ = flags;
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&pFile);
  if (mVar1 == 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    __stream = fopen64(pDst_filename,"wb");
    if (__stream == (FILE *)0x0) {
      pZip_local._4_4_ = 0;
    }
    else {
      file_stat.m_comment._248_4_ =
           mz_zip_reader_extract_to_callback
                     (pZip,file_index,(anonymous_namespace)::miniz::mz_zip_file_write_callback,
                      __stream,file_stat.m_comment._252_4_);
      iVar2 = fclose(__stream);
      if (iVar2 == -1) {
        pZip_local._4_4_ = 0;
      }
      else {
        if (file_stat.m_comment._248_4_ != 0) {
          (anonymous_namespace)::miniz::mz_zip_set_file_times
                    (pDst_filename,file_stat._8_8_,file_stat._8_8_);
        }
        pZip_local._4_1_ = file_stat.m_comment[0xf8];
        pZip_local._5_1_ = file_stat.m_comment[0xf9];
        pZip_local._6_1_ = file_stat.m_comment[0xfa];
        pZip_local._7_1_ = file_stat.m_comment[0xfb];
      }
    }
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index,
                                      const char *pDst_filename,
                                      mz_uint flags) {
  mz_bool status;
  mz_zip_archive_file_stat file_stat;
  MZ_FILE *pFile;
  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;
  pFile = MZ_FOPEN(pDst_filename, "wb");
  if (!pFile)
    return MZ_FALSE;
  status = mz_zip_reader_extract_to_callback(
      pZip, file_index, mz_zip_file_write_callback, pFile, flags);
  if (MZ_FCLOSE(pFile) == EOF)
    return MZ_FALSE;
#ifndef MINIZ_NO_TIME
  if (status)
    mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif
  return status;
}